

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operation.cc
# Opt level: O0

ostream * operator<<(ostream *out,Operation *op)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Operation *op_local;
  ostream *out_local;
  
  iVar1 = (*op->_vptr_Operation[2])();
  poVar2 = (ostream *)std::ostream::operator<<(out,*(long *)CONCAT44(extraout_var,iVar1));
  poVar2 = std::operator<<(poVar2,' ');
  iVar1 = (*op->_vptr_Operation[4])();
  poVar2 = std::operator<<(poVar2,(char)iVar1);
  poVar2 = std::operator<<(poVar2,' ');
  iVar1 = (*op->_vptr_Operation[3])();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(long *)CONCAT44(extraout_var_00,iVar1));
  poVar2 = std::operator<<(poVar2," = ");
  iVar1 = (*op->_vptr_Operation[5])();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,CONCAT44(extraout_var_01,iVar1));
  return poVar2;
}

Assistant:

ostream &operator<<(ostream &out, const Operation &op)
{
	return out << op.left() << ' ' << op.opchar() << ' ' << op.right()
		   << " = " << op.result();
}